

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::AdvancedUnsizedArrayLength<1>::Run(AdvancedUnsizedArrayLength<1> *this)

{
  int iVar1;
  bool bVar2;
  GLuint GVar3;
  reference data_00;
  uint *puVar4;
  CallLogWrapper *this_00;
  uint local_c4;
  int i_1;
  bool status;
  int *dataout;
  allocator<int> local_a5;
  int i;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> data;
  int sizes [4];
  undefined1 local_60 [8];
  string glsl_fs;
  string glsl_vs;
  int kBufs;
  int kSize;
  AdvancedUnsizedArrayLength<1> *this_local;
  
  bVar2 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,0,4);
  if (bVar2) {
    glcts::(anonymous_namespace)::AdvancedUnsizedArrayLength<1>::BuildShaderPT_abi_cxx11_
              ((string *)((long)&glsl_fs.field_2 + 8),this,0);
    glcts::(anonymous_namespace)::AdvancedUnsizedArrayLength<1>::BuildShader_abi_cxx11_
              ((string *)local_60,this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,
                       (string *)((long)&glsl_fs.field_2 + 8),(string *)local_60);
    this->m_program = GVar3;
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(glsl_fs.field_2._M_local_buf + 8));
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar2) {
      this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x300000007;
      i = 0x29;
      std::allocator<int>::allocator(&local_a5);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_a0,10000,&i,&local_a5);
      std::allocator<int>::~allocator(&local_a5);
      for (dataout._4_4_ = 0; (int)dataout._4_4_ < 4; dataout._4_4_ = dataout._4_4_ + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,dataout._4_4_,
                   this->m_storage_buffer[(int)dataout._4_4_]);
        iVar1 = sizes[(long)(int)dataout._4_4_ + -2];
        data_00 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_a0,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,(long)(iVar1 << 2),data_00,0x88ea);
      }
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[3]);
      puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                 (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                   super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x14,1);
      if (puVar4 == (uint *)0x0) {
        this_local = (AdvancedUnsizedArrayLength<1> *)&DAT_ffffffffffffffff;
      }
      else {
        bVar2 = true;
        for (local_c4 = 0; (int)local_c4 < 3; local_c4 = local_c4 + 1) {
          if (puVar4[(int)(local_c4 + 1)] != sizes[(long)(int)local_c4 + -2]) {
            anon_unknown_0::Output
                      ("Array %d length is %d should be %d.\n",(ulong)local_c4,
                       (ulong)puVar4[(int)(local_c4 + 1)],
                       (ulong)(uint)sizes[(long)(int)local_c4 + -2]);
            bVar2 = false;
          }
        }
        if (*puVar4 != 4) {
          anon_unknown_0::Output("Array %d length is %d should be %d.\n",3,(ulong)*puVar4,4);
          bVar2 = false;
        }
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        if (bVar2) {
          this_local = (AdvancedUnsizedArrayLength<1> *)0x0;
        }
        else {
          this_local = (AdvancedUnsizedArrayLength<1> *)&DAT_ffffffffffffffff;
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0)
      ;
    }
    else {
      this_local = (AdvancedUnsizedArrayLength<1> *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedUnsizedArrayLength<1> *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const int kSize = 10000;
		const int kBufs = 4;
		if ((stage == vertex && !IsVSFSAvailable(kBufs, 0)) || (stage == fragment && !IsVSFSAvailable(0, kBufs)))
			return NOT_SUPPORTED;
		if (stage == vertex)
		{
			std::string glsl_vs = BuildShader();
			std::string glsl_fs = BuildShaderPT(fragment);
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else if (stage == fragment)
		{
			std::string glsl_vs = BuildShaderPT(vertex);
			std::string glsl_fs = BuildShader();
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else
		{ // compute
			std::string glsl_cs = BuildShader();
			m_program			= CreateProgramCS(glsl_cs);
		}
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;
		glUseProgram(m_program);

		glGenBuffers(kBufs, m_storage_buffer);
		int				 sizes[kBufs] = { 7, 3, 4, 5 };
		std::vector<int> data(kSize, 41);
		for (int i = 0; i < kBufs; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizes[i] * 4, &data[0], GL_DYNAMIC_COPY);
		}

		if (stage != compute)
		{
			glGenVertexArrays(1, &m_vertex_array);
			glBindVertexArray(m_vertex_array);
			glDrawArrays(GL_POINTS, 0, 1);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
		int* dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizes[kBufs - 1], GL_MAP_READ_BIT);
		if (!dataout)
			return ERROR;
		bool status = true;
		for (int i = 0; i < kBufs - 1; ++i)
			if (dataout[i + 1] != sizes[i])
			{
				Output("Array %d length is %d should be %d.\n", i, dataout[i + 1], sizes[i]);
				status = false;
			}
		if (dataout[0] != sizes[kBufs - 1] - 1)
		{
			Output("Array %d length is %d should be %d.\n", kBufs - 1, dataout[0], sizes[kBufs - 1] - 1);
			status = false;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		if (!status)
			return ERROR;

		return NO_ERROR;
	}